

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR lyd_value_validate_incomplete
                 (ly_ctx *ctx,lysc_type *type,lyd_value *val,lyd_node *ctx_node,lyd_node *tree)

{
  lysc_type *ctx_00;
  undefined8 uVar1;
  ly_err_item *local_48;
  ly_err_item *err;
  lyd_node *plStack_38;
  LY_ERR ret;
  lyd_node *tree_local;
  lyd_node *ctx_node_local;
  lyd_value *val_local;
  lysc_type *type_local;
  ly_ctx *ctx_local;
  
  local_48 = (ly_err_item *)0x0;
  plStack_38 = tree;
  tree_local = ctx_node;
  ctx_node_local = (lyd_node *)val;
  val_local = (lyd_value *)type;
  type_local = (lysc_type *)ctx;
  if (type->plugin->validate != (lyplg_type_validate_clb)0x0) {
    err._4_4_ = (*type->plugin->validate)(ctx,type,ctx_node,tree,val,&local_48);
    ctx_00 = type_local;
    if (err._4_4_ == LY_SUCCESS) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
    else {
      if (local_48 == (ly_err_item *)0x0) {
        uVar1 = (*(code *)((val_local->field_2).ident)->exts)(type_local,ctx_node_local,0,0,0);
        ly_vlog((ly_ctx *)ctx_00,(char *)0x0,LYVE_OTHER,"Resolving value \"%s\" failed.",uVar1);
      }
      else {
        ly_err_print_build_path((ly_ctx *)type_local,tree_local,(lysc_node *)0x0,local_48);
        ly_err_free(local_48);
      }
      ctx_local._4_4_ = err._4_4_;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("type->plugin->validate",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                ,0x233,
                "LY_ERR lyd_value_validate_incomplete(const struct ly_ctx *, const struct lysc_type *, struct lyd_value *, const struct lyd_node *, const struct lyd_node *)"
               );
}

Assistant:

LY_ERR
lyd_value_validate_incomplete(const struct ly_ctx *ctx, const struct lysc_type *type, struct lyd_value *val,
        const struct lyd_node *ctx_node, const struct lyd_node *tree)
{
    LY_ERR ret;
    struct ly_err_item *err = NULL;

    assert(type->plugin->validate);

    ret = type->plugin->validate(ctx, type, ctx_node, tree, val, &err);
    if (ret) {
        if (err) {
            ly_err_print_build_path(ctx, ctx_node, NULL, err);
            ly_err_free(err);
        } else {
            LOGVAL(ctx, LYVE_OTHER, "Resolving value \"%s\" failed.",
                    (char *)type->plugin->print(ctx, val, LY_VALUE_CANON, NULL, NULL, NULL));
        }
        return ret;
    }

    return LY_SUCCESS;
}